

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dynamic.hpp
# Opt level: O0

void __thiscall
ELFIO::dynamic_section_accessor_template<ELFIO::section>::generic_get_entry_dyn<ELFIO::Elf64_Dyn>
          (dynamic_section_accessor_template<ELFIO::section> *this,Elf_Xword index,Elf_Xword *tag,
          Elf_Xword *value)

{
  int iVar1;
  int iVar2;
  endianness_convertor *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  int64_t *piVar3;
  Elf_Xword EVar4;
  uint64_t uVar5;
  ulong uVar6;
  Elf64_Dyn *pEntry;
  Elf_Xword offset;
  endianness_convertor *convertor;
  Elf_Xword *value_local;
  Elf_Xword *tag_local;
  Elf_Xword index_local;
  dynamic_section_accessor_template<ELFIO::section> *this_local;
  
  this_00 = elfio::get_convertor(this->elf_file);
  iVar1 = (*this->dynamic_section->_vptr_section[0x18])();
  if ((CONCAT44(extraout_var,iVar1) == 0) ||
     (iVar1 = (*this->dynamic_section->_vptr_section[0xf])(), CONCAT44(extraout_var_00,iVar1) < 0x10
     )) {
    *tag = 0;
    *value = 0;
    return;
  }
  iVar1 = (*this->dynamic_section->_vptr_section[0x13])();
  iVar2 = (*this->dynamic_section->_vptr_section[0xf])();
  if (CONCAT44(extraout_var_01,iVar1) / CONCAT44(extraout_var_02,iVar2) - 1 < index) {
    *tag = 0;
    *value = 0;
    return;
  }
  iVar1 = (*this->dynamic_section->_vptr_section[0xf])();
  uVar6 = index * CONCAT44(extraout_var_03,iVar1);
  iVar1 = (*this->dynamic_section->_vptr_section[0x13])();
  if (CONCAT44(extraout_var_04,iVar1) - 0x10U < uVar6) {
    *tag = 0;
    *value = 0;
    return;
  }
  iVar1 = (*this->dynamic_section->_vptr_section[0x18])();
  piVar3 = (int64_t *)(CONCAT44(extraout_var_05,iVar1) + uVar6);
  EVar4 = endianness_convertor::operator()(this_00,*piVar3);
  *tag = EVar4;
  EVar4 = *tag;
  if (EVar4 == 0) goto LAB_00128011;
  if (EVar4 - 1 < 2) {
LAB_0012801e:
    uVar5 = endianness_convertor::operator()(this_00,piVar3[1]);
    *value = uVar5;
  }
  else {
    if (4 < EVar4 - 3) {
      if (EVar4 - 8 < 4) goto LAB_0012801e;
      if (1 < EVar4 - 0xc) {
        if (EVar4 - 0xe < 2) goto LAB_0012801e;
        if (EVar4 == 0x10) goto LAB_00128011;
        if (EVar4 != 0x11) {
          if (EVar4 - 0x12 < 3) goto LAB_0012801e;
          if (EVar4 != 0x15) {
            if (EVar4 == 0x16) {
LAB_00128011:
              *value = 0;
              return;
            }
            if (EVar4 != 0x17) {
              if (EVar4 == 0x18) goto LAB_00128011;
              if ((1 < EVar4 - 0x19) && ((EVar4 - 0x1b < 4 || ((EVar4 != 0x20 && (EVar4 == 0x21)))))
                 ) goto LAB_0012801e;
            }
          }
        }
      }
    }
    uVar5 = endianness_convertor::operator()(this_00,piVar3[1]);
    *value = uVar5;
  }
  return;
}

Assistant:

void generic_get_entry_dyn( Elf_Xword  index,
                                Elf_Xword& tag,
                                Elf_Xword& value ) const
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        // Check unusual case when dynamic section has no data
        if ( dynamic_section->get_data() == nullptr ||
             dynamic_section->get_entry_size() < sizeof( T ) ) {
            tag   = DT_NULL;
            value = 0;
            return;
        }

        // Check for integer overflow in size calculation
        if (index > (dynamic_section->get_size() / dynamic_section->get_entry_size()) - 1) {
            tag   = DT_NULL;
            value = 0;
            return;
        }

        // Check for integer overflow in pointer arithmetic
        Elf_Xword offset = index * dynamic_section->get_entry_size();
        if (offset > dynamic_section->get_size() - sizeof(T)) {
            tag   = DT_NULL;
            value = 0;
            return;
        }

        const T* pEntry = reinterpret_cast<const T*>(
            dynamic_section->get_data() + offset );
        tag = convertor( pEntry->d_tag );
        switch ( tag ) {
        case DT_NULL:
        case DT_SYMBOLIC:
        case DT_TEXTREL:
        case DT_BIND_NOW:
            value = 0;
            break;
        case DT_NEEDED:
        case DT_PLTRELSZ:
        case DT_RELASZ:
        case DT_RELAENT:
        case DT_STRSZ:
        case DT_SYMENT:
        case DT_SONAME:
        case DT_RPATH:
        case DT_RELSZ:
        case DT_RELENT:
        case DT_PLTREL:
        case DT_INIT_ARRAYSZ:
        case DT_FINI_ARRAYSZ:
        case DT_RUNPATH:
        case DT_FLAGS:
        case DT_PREINIT_ARRAYSZ:
            value = convertor( pEntry->d_un.d_val );
            break;
        case DT_PLTGOT:
        case DT_HASH:
        case DT_STRTAB:
        case DT_SYMTAB:
        case DT_RELA:
        case DT_INIT:
        case DT_FINI:
        case DT_REL:
        case DT_DEBUG:
        case DT_JMPREL:
        case DT_INIT_ARRAY:
        case DT_FINI_ARRAY:
        case DT_PREINIT_ARRAY:
        default:
            value = convertor( pEntry->d_un.d_ptr );
            break;
        }
    }